

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

Aig_Obj_t * Rtm_ManToAig_rec(Aig_Man_t *pNew,Rtm_Man_t *pRtm,Rtm_Obj_t *pObjRtm,int *pLatches)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *p0;
  uint uVar4;
  uint *puVar5;
  ulong uVar6;
  
  p0 = (Aig_Obj_t *)pObjRtm->pCopy;
  if (p0 == (Aig_Obj_t *)0x0) {
    p0 = pNew->pConst1;
    if ((*(ushort *)&pObjRtm->field_0x8 & 0x7f80) != 0) {
      puVar5 = (uint *)&pObjRtm[1].field_0x8;
      uVar6 = 0;
      do {
        uVar4 = *puVar5;
        uVar1 = uVar4 & 0xfff;
        if (uVar1 == 0) {
          pAVar3 = Rtm_ManToAig_rec(pNew,pRtm,*(Rtm_Obj_t **)(puVar5 + -2),pLatches);
        }
        else {
          if (uVar1 < 0xb) {
            uVar4 = uVar4 >> 0xc;
          }
          else {
            uVar4 = pRtm->pExtra[uVar4 >> 0xc];
          }
          uVar2 = uVar1 + pLatches[uVar6 + (long)pObjRtm->Id * 2];
          if ((uVar2 == 0 ||
               SCARRY4(uVar1,pLatches[uVar6 + (long)pObjRtm->Id * 2]) != (int)uVar2 < 0) ||
             (pNew->vCis->nSize < (int)uVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pAVar3 = (Aig_Obj_t *)
                   ((ulong)((uVar4 & 3) == 2) ^ (ulong)pNew->vCis->pArray[(ulong)uVar2 - 1]);
        }
        p0 = Aig_And(pNew,p0,(Aig_Obj_t *)
                             ((ulong)((*(uint *)&pObjRtm->field_0x8 >>
                                       ((byte)(6 - (uVar6 == 0)) & 0x1f) & 1) != 0) ^ (ulong)pAVar3)
                    );
        uVar6 = uVar6 + 1;
        puVar5 = puVar5 + 4;
      } while (uVar6 < (*(uint *)&pObjRtm->field_0x8 >> 7 & 0xff));
    }
    pObjRtm->pCopy = p0;
  }
  return p0;
}

Assistant:

Aig_Obj_t * Rtm_ManToAig_rec( Aig_Man_t * pNew, Rtm_Man_t * pRtm, Rtm_Obj_t * pObjRtm, int * pLatches )
{
    Rtm_Edg_t * pEdge;
    Aig_Obj_t * pRes, * pFanin;
    int k, Val;
    if ( pObjRtm->pCopy )
        return (Aig_Obj_t *)pObjRtm->pCopy;
    // get the inputs
    pRes = Aig_ManConst1( pNew );
    Rtm_ObjForEachFaninEdge( pObjRtm, pEdge, k )
    {
        if ( pEdge->nLats == 0 )
            pFanin = Rtm_ManToAig_rec( pNew, pRtm, Rtm_ObjFanin(pObjRtm, k), pLatches );
        else
        {
            Val = Rtm_ObjGetFirst( pRtm, pEdge );
            pFanin = Aig_ManCi( pNew, pLatches[2*pObjRtm->Id + k] + pEdge->nLats - 1 );
            pFanin = Aig_NotCond( pFanin, Val == RTM_VAL_ONE );
        }
        pFanin = Aig_NotCond( pFanin, k ? pObjRtm->fCompl1 : pObjRtm->fCompl0 );
        pRes = Aig_And( pNew, pRes, pFanin );
    }
    return (Aig_Obj_t *)(pObjRtm->pCopy = pRes);
}